

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

void lest::inform(location *where,text *expr)

{
  undefined8 uVar1;
  char unaff_BPL;
  void *unaff_R12;
  void *unaff_R13;
  long *local_1d8;
  long local_1c8 [2];
  void *local_1b8;
  long local_1a8;
  long *local_198;
  long local_188 [2];
  long *local_178;
  long local_168 [6];
  location *local_138;
  long local_128;
  void *local_f8;
  long local_e8;
  message local_a8;
  
  uVar1 = __cxa_rethrow();
  message::~message(&local_a8);
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if (local_198 != local_188) {
    operator_delete(local_198,local_188[0] + 1);
  }
  if (local_1b8 != unaff_R12) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if (local_138 != where) {
    operator_delete(local_138,local_128 + 1);
  }
  if (local_f8 != unaff_R13) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (unaff_BPL != '\0') {
    __cxa_free_exception();
  }
  __cxa_end_catch();
  _Unwind_Resume(uVar1);
}

Assistant:

inline void inform( location where, text expr )
{
    try
    {
        throw;
    }
    catch( failure const & )
    {
        throw;
    }
    catch( std::exception const & e )
    {
        throw unexpected( where, expr, with_message( e.what() ) ); \
    }
    catch(...)
    {
        throw unexpected( where, expr, "of unknown type" ); \
    }
}